

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

bool Random_SanityCheck(void)

{
  long lVar1;
  ulong uVar2;
  int x;
  uint uVar3;
  long lVar4;
  undefined4 extraout_var;
  RNGState *this;
  int x_1;
  ulong uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  uint64_t stop;
  uint64_t start;
  CSHA512 to_add;
  bool overwritten [32];
  uint8_t data [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = rdtsc();
  uVar5 = uVar5 & 0xffffffff00000000 | CONCAT44((int)((ulong)lVar1 >> 0x20),(int)uVar5);
  overwritten[0x10] = false;
  overwritten[0x11] = false;
  overwritten[0x12] = false;
  overwritten[0x13] = false;
  overwritten[0x14] = false;
  overwritten[0x15] = false;
  overwritten[0x16] = false;
  overwritten[0x17] = false;
  overwritten[0x18] = false;
  overwritten[0x19] = false;
  overwritten[0x1a] = false;
  overwritten[0x1b] = false;
  overwritten[0x1c] = false;
  overwritten[0x1d] = false;
  overwritten[0x1e] = false;
  overwritten[0x1f] = false;
  overwritten[0] = false;
  overwritten[1] = false;
  overwritten[2] = false;
  overwritten[3] = false;
  overwritten[4] = false;
  overwritten[5] = false;
  overwritten[6] = false;
  overwritten[7] = false;
  overwritten[8] = false;
  overwritten[9] = false;
  overwritten[10] = false;
  overwritten[0xb] = false;
  overwritten[0xc] = false;
  overwritten[0xd] = false;
  overwritten[0xe] = false;
  overwritten[0xf] = false;
  uVar6 = 0;
  start = uVar5;
  do {
    data[0x10] = '\0';
    data[0x11] = '\0';
    data[0x12] = '\0';
    data[0x13] = '\0';
    data[0x14] = '\0';
    data[0x15] = '\0';
    data[0x16] = '\0';
    data[0x17] = '\0';
    data[0x18] = '\0';
    data[0x19] = '\0';
    data[0x1a] = '\0';
    data[0x1b] = '\0';
    data[0x1c] = '\0';
    data[0x1d] = '\0';
    data[0x1e] = '\0';
    data[0x1f] = '\0';
    data[0] = '\0';
    data[1] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    data[4] = '\0';
    data[5] = '\0';
    data[6] = '\0';
    data[7] = '\0';
    data[8] = '\0';
    data[9] = '\0';
    data[10] = '\0';
    data[0xb] = '\0';
    data[0xc] = '\0';
    data[0xd] = '\0';
    data[0xe] = '\0';
    data[0xf] = '\0';
    anon_unknown.dwarf_11b063f::GetOSRand(data);
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      overwritten[lVar4] = (bool)(overwritten[lVar4] | data[lVar4] != '\0');
    }
    uVar3 = 0;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      uVar3 = uVar3 + overwritten[lVar4];
    }
    if (0x1f < uVar3) break;
    bVar7 = uVar6 < 0x3ff;
    uVar6 = uVar6 + 1;
  } while (bVar7);
  if (uVar3 == 0x20) {
    to_add.s[0] = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&to_add);
    uVar2 = rdtsc();
    stop = uVar2 & 0xffffffff00000000 | CONCAT44(extraout_var,(int)uVar2);
    bVar7 = stop != uVar5;
    if (bVar7) {
      CSHA512::CSHA512(&to_add);
      CSHA512::Write(&to_add,(uchar *)&start,8);
      CSHA512::Write(&to_add,(uchar *)&stop,8);
      this = anon_unknown.dwarf_11b063f::GetRNGState();
      anon_unknown.dwarf_11b063f::RNGState::MixExtract(this,(uchar *)0x0,0,&to_add,false,true);
    }
  }
  else {
    bVar7 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool Random_SanityCheck()
{
    uint64_t start = GetPerformanceCounter();

    /* This does not measure the quality of randomness, but it does test that
     * GetOSRand() overwrites all 32 bytes of the output given a maximum
     * number of tries.
     */
    static constexpr int MAX_TRIES{1024};
    uint8_t data[NUM_OS_RANDOM_BYTES];
    bool overwritten[NUM_OS_RANDOM_BYTES] = {}; /* Tracks which bytes have been overwritten at least once */
    int num_overwritten;
    int tries = 0;
    /* Loop until all bytes have been overwritten at least once, or max number tries reached */
    do {
        memset(data, 0, NUM_OS_RANDOM_BYTES);
        GetOSRand(data);
        for (int x=0; x < NUM_OS_RANDOM_BYTES; ++x) {
            overwritten[x] |= (data[x] != 0);
        }

        num_overwritten = 0;
        for (int x=0; x < NUM_OS_RANDOM_BYTES; ++x) {
            if (overwritten[x]) {
                num_overwritten += 1;
            }
        }

        tries += 1;
    } while (num_overwritten < NUM_OS_RANDOM_BYTES && tries < MAX_TRIES);
    if (num_overwritten != NUM_OS_RANDOM_BYTES) return false; /* If this failed, bailed out after too many tries */

    // Check that GetPerformanceCounter increases at least during a GetOSRand() call + 1ms sleep.
    std::this_thread::sleep_for(std::chrono::milliseconds(1));
    uint64_t stop = GetPerformanceCounter();
    if (stop == start) return false;

    // We called GetPerformanceCounter. Use it as entropy.
    CSHA512 to_add;
    to_add.Write((const unsigned char*)&start, sizeof(start));
    to_add.Write((const unsigned char*)&stop, sizeof(stop));
    GetRNGState().MixExtract(nullptr, 0, std::move(to_add), false, /*always_use_real_rng=*/true);

    return true;
}